

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O2

void __thiscall
lzham::lzcompressor::coding_stats::update
          (coding_stats *this,lzdecision *lzdec,state *cur_state,search_accelerator *dict,
          bit_cost_t cost)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  tracked_stat *this_00;
  ulong uVar11;
  double val;
  double dVar12;
  double dVar13;
  
  uVar2 = this->m_total_bytes;
  uVar3 = this->m_total_contexts;
  this->m_total_bytes = lzdec->m_len + (uint)(lzdec->m_len == 0) + uVar2;
  this->m_total_contexts = uVar3 + 1;
  val = (double)((float)cost * 5.9604645e-08);
  this->m_total_cost = this->m_total_cost + val;
  tracked_stat::update(&this->m_context_stats,val);
  uVar4 = (cur_state->super_state_base).m_cur_state;
  uVar5 = lzdec->m_len;
  uVar11 = (ulong)uVar5;
  if (uVar11 == 0) {
    dVar12 = (double)((float)*(uint *)((long)&g_prob_cost +
                                      (ulong)cur_state->m_is_match_model[uVar4].m_bit_0_prob * 4) *
                     5.9604645e-08);
    this->m_total_is_match0_bits_cost = this->m_total_is_match0_bits_cost + dVar12;
    this->m_total_match_bits_cost = this->m_total_match_bits_cost + dVar12;
    dVar13 = this->m_worst_match_bits_cost;
    if (this->m_worst_match_bits_cost <= dVar12) {
      dVar13 = dVar12;
    }
    this->m_worst_match_bits_cost = dVar13;
    this->m_total_nonmatches = this->m_total_nonmatches + 1;
    if ((cur_state->super_state_base).m_cur_state < 7) {
      this_00 = &this->m_lit_stats;
    }
    else {
      this_00 = &this->m_delta_lit_stats;
    }
LAB_0010ea0f:
    tracked_stat::update(this_00,val);
    return;
  }
  if ((int)uVar5 < 0x102) {
    if ((int)uVar5 < 1) {
      uVar8 = 0;
    }
    else {
      uVar8 = lzdec->m_dist;
      if ((int)uVar8 < 0) {
        uVar8 = (cur_state->super_state_base).m_match_hist[~uVar8];
      }
    }
    uVar6 = 0x101;
    if (dict->m_lookahead_size < 0x101) {
      uVar6 = dict->m_lookahead_size;
    }
    uVar7 = 0;
    uVar6 = search_accelerator::get_match_len(dict,0,uVar8,uVar6,0);
    if (uVar6 < uVar5) {
      lzham_assert("match_len <= actual_match_len",
                   "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_lzcomp_state.cpp"
                   ,0x64d);
    }
    uVar8 = uVar6 - uVar5;
    this->m_total_truncated_matches =
         this->m_total_truncated_matches + (uint)(uVar5 <= uVar6 && uVar8 != 0);
    if (0 < (int)uVar8) {
      uVar7 = (ulong)uVar8;
    }
    this->m_match_truncation_len_hist[uVar7] = this->m_match_truncation_len_hist[uVar7] + 1;
    uVar9 = (ulong)(uint)~lzdec->m_dist;
    uVar7 = 4;
    if (lzdec->m_dist < 1) {
      uVar7 = uVar9;
    }
    if (lzdec->m_len < 1) {
      uVar7 = uVar9;
    }
    lVar10 = 0x95c;
    if (uVar5 < uVar6) {
      this->m_match_truncation_hist[uVar11] = this->m_match_truncation_hist[uVar11] + 1;
      lVar10 = 0x86c;
    }
    piVar1 = (int *)((long)this->m_match_truncation_len_hist +
                    uVar7 * 4 + (ulong)(cur_state->super_state_base).m_cur_state * 0x14 + lVar10 +
                    -0x5c);
    *piVar1 = *piVar1 + 1;
    dVar12 = (double)((float)*(uint *)((long)&g_prob_cost +
                                      (ulong)(0x800 - cur_state->m_is_match_model[uVar4].
                                                      m_bit_0_prob) * 4) * 5.9604645e-08);
    this->m_total_is_match1_bits_cost = this->m_total_is_match1_bits_cost + dVar12;
    this->m_total_match_bits_cost = this->m_total_match_bits_cost + dVar12;
    dVar13 = this->m_worst_match_bits_cost;
    if (this->m_worst_match_bits_cost <= dVar12) {
      dVar13 = dVar12;
    }
    this->m_worst_match_bits_cost = dVar13;
    this->m_total_matches = this->m_total_matches + 1;
    uVar4 = lzdec->m_dist;
    if ((int)uVar4 < 0) {
      tracked_stat::update(this->m_rep_stats + ~uVar4,val);
      if (uVar4 == 0xffffffff) {
        if (lzdec->m_len == 1) {
          this_00 = &this->m_rep0_len1_stats;
        }
        else {
          this_00 = &this->m_rep0_len2_plus_stats;
        }
        goto LAB_0010ea0f;
      }
    }
    else {
      tracked_stat::update(this->m_full_match_stats + (int)uVar5,val);
      if (uVar11 == 2) {
        if (lzdec->m_dist < 0x201) {
          this->m_total_near_len2_matches = this->m_total_near_len2_matches + 1;
        }
        else {
          this->m_total_far_len2_matches = this->m_total_far_len2_matches + 1;
        }
        uVar6 = lzdec->m_dist;
        if (lzdec->m_dist < (int)this->m_max_len2_dist) {
          uVar6 = this->m_max_len2_dist;
        }
        this->m_max_len2_dist = uVar6;
      }
    }
  }
  return;
}

Assistant:

void lzcompressor::coding_stats::update(const lzdecision& lzdec, const state& cur_state, const search_accelerator& dict, bit_cost_t cost)
   {
      m_total_bytes += lzdec.get_len();
      m_total_contexts++;

      float cost_in_bits = cost / (float)cBitCostScale;
      LZHAM_ASSERT(cost_in_bits > 0.0f);
      m_total_cost += cost_in_bits;

      m_context_stats.update(cost_in_bits);

      //uint match_pred = cur_state.get_pred_char(dict, lzdec.m_pos, 1);
      uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(cur_state.m_cur_state);

      if (lzdec.m_len == 0)
      {
         float match_bit_cost = cur_state.m_is_match_model[is_match_model_index].get_cost(0) / (float)cBitCostScale;

         m_total_is_match0_bits_cost += match_bit_cost;
         m_total_match_bits_cost += match_bit_cost;
         m_worst_match_bits_cost = math::maximum<double>(m_worst_match_bits_cost, static_cast<double>(match_bit_cost));
         m_total_nonmatches++;

         if (cur_state.m_cur_state < CLZBase::cNumLitStates)
         {
            m_lit_stats.update(cost_in_bits);
         }
         else
         {
            m_delta_lit_stats.update(cost_in_bits);
         }
      }
      else if (lzdec.m_len <= CLZBase::cMaxMatchLen)
      {
         const uint match_len = lzdec.get_len();

         {
            uint match_dist = lzdec.get_match_dist(cur_state);

            uint cur_lookahead_size = dict.get_lookahead_size();

            uint actual_match_len = dict.get_match_len(0, match_dist, LZHAM_MIN(cur_lookahead_size, static_cast<uint>(CLZBase::cMaxMatchLen)));
            LZHAM_VERIFY(match_len <= actual_match_len);

            m_total_truncated_matches += match_len < actual_match_len;
            m_match_truncation_len_hist[math::maximum<int>(0, actual_match_len - match_len)]++;

            uint type_index = 4;
            if (!lzdec.is_full_match())
            {
               LZHAM_ASSUME(CLZBase::cMatchHistSize == 4);
               type_index = -lzdec.m_dist - 1;
            }

            if (actual_match_len > match_len)
            {
               m_match_truncation_hist[match_len]++;

               m_match_type_truncation_hist[cur_state.m_cur_state][type_index]++;
            }
            else
            {
               m_match_type_was_not_truncated_hist[cur_state.m_cur_state][type_index]++;
            }
         }

         float match_bit_cost = cur_state.m_is_match_model[is_match_model_index].get_cost(1) / (float)cBitCostScale;
         m_total_is_match1_bits_cost += match_bit_cost;
         m_total_match_bits_cost += match_bit_cost;
         m_worst_match_bits_cost = math::maximum<double>(m_worst_match_bits_cost, static_cast<double>(match_bit_cost));
         m_total_matches++;

         if (lzdec.m_dist < 0)
         {
            // rep match
            int match_hist_index = -lzdec.m_dist - 1;
            LZHAM_ASSERT(match_hist_index < CLZBase::cMatchHistSize);

            m_rep_stats[match_hist_index].update(cost_in_bits);

            if (!match_hist_index)
            {
               // rep0 match
               if (lzdec.m_len == 1)
               {
                  m_rep0_len1_stats.update(cost_in_bits);
               }
               else
               {
                  m_rep0_len2_plus_stats.update(cost_in_bits);
               }
            }
         }
         else
         {
            m_full_match_stats[math::minimum<int>(cMaxMatchLen, match_len)].update(cost_in_bits);

            if (match_len == 2)
            {
               if (lzdec.m_dist <= 512)
                  m_total_near_len2_matches++;
               else
                  m_total_far_len2_matches++;

               m_max_len2_dist = LZHAM_MAX((int)m_max_len2_dist, lzdec.m_dist);
            }
         }
      }
      else
      {
         // TODO: Handle huge matches.
      }
   }